

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcplisten.c
# Opt level: O1

int tcp_listener_get_port(void *arg,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  undefined1 local_b8 [2];
  ushort uStack_b6;
  nng_sockaddr sa;
  size_t sz;
  
  sa.s_storage.sa_pad[0xf] = 0x88;
  tcp_listener_get_locaddr(arg,local_b8,sa.s_storage.sa_pad + 0xf,NNI_TYPE_SOCKADDR);
  iVar1 = 0xb;
  if ((ushort)((short)_local_b8 - 3U) < 2) {
    iVar1 = nni_copyout_int((uint)(ushort)(uStack_b6 << 8 | uStack_b6 >> 8),buf,szp,t);
  }
  return iVar1;
}

Assistant:

static int
tcp_listener_get_port(void *arg, void *buf, size_t *szp, nni_type t)
{
	tcp_listener *l = arg;
	nng_sockaddr  sa;
	size_t        sz;
	int           port;
	uint8_t      *paddr;

	sz = sizeof(sa);
	(void) tcp_listener_get_locaddr(l, &sa, &sz, NNI_TYPE_SOCKADDR);

	switch (sa.s_family) {
	case NNG_AF_INET:
		paddr = (void *) &sa.s_in.sa_port;
		break;

	case NNG_AF_INET6:
		paddr = (void *) &sa.s_in6.sa_port;
		break;

	default:
		return (NNG_ESTATE);
	}

	NNI_GET16(paddr, port);
	return (nni_copyout_int(port, buf, szp, t));
}